

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

bool_t rngTestFIPS4(octet *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = (bool)(*buf & 1);
  uVar1 = 1;
  uVar2 = uVar1;
  uVar3 = uVar1;
  do {
    if (uVar2 == 20000) {
      return (bool_t)(uVar3 < 0x1a);
    }
    if (((buf[uVar2 >> 3] >> ((uint)uVar2 & 7) & 1) != 0) == bVar4) {
      uVar3 = uVar3 + 1;
    }
    else {
      if (0x19 < uVar3) {
        return 0;
      }
      bVar4 = bVar4 == false;
      uVar3 = uVar1;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool_t rngTestFIPS4(const octet buf[2500])
{
	octet b;
	size_t l;
	size_t i;
	ASSERT(memIsValid(buf, 2500));
	b = buf[0] & 1;
	l = 1;
	for (i = 1; i < 20000; ++i)
		if ((buf[i / 8] >> i % 8 & 1) == b)
			++l;
		else
		{
			if (l >= 26)
				return FALSE;
			b = !b, l = 1;
		}
	return l < 26;
}